

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u32 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  u32 uVar6;
  u32 uVar7;
  u32 uVar8;
  u8 *p;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint nativeCksum;
  int iVar12;
  int n;
  long in_FS_OFFSET;
  u32 local_e0;
  long local_d0;
  u32 *page0;
  i64 nSize;
  undefined8 local_a8;
  undefined8 uStack_a0;
  u8 *local_90;
  u8 *local_88;
  u8 *local_80;
  u8 *local_78;
  long *local_70;
  u32 *local_68;
  u32 *local_60;
  undefined4 local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = walIndexPage(pWal,0,&page0);
  if (iVar3 != 0) goto LAB_001261c1;
  if ((page0 == (u32 *)0x0) || (iVar3 = walIndexTryHdr(pWal,pChanged), iVar3 != 0)) {
    if ((pWal->readOnly & 2) != 0) {
      iVar3 = walLockShared(pWal,0);
      if (iVar3 == 0) {
        walUnlockShared(pWal,0);
        iVar3 = 0x108;
      }
      goto LAB_001261c1;
    }
    iVar3 = walLockExclusive(pWal,0,1);
    if (iVar3 != 0) goto LAB_001261c1;
    pWal->writeLock = '\x01';
    iVar3 = 0;
    iVar4 = walIndexPage(pWal,0,&page0);
    if (iVar4 == 0) {
      iVar4 = walIndexTryHdr(pWal,pChanged);
      if (iVar4 == 0) {
        bVar2 = true;
      }
      else {
        n = 7 - (uint)pWal->ckptLock;
        iVar4 = pWal->ckptLock + 1;
        iVar3 = walLockExclusive(pWal,iVar4,n);
        if (iVar3 == 0) {
          (pWal->hdr).aSalt[0] = 0;
          (pWal->hdr).aSalt[1] = 0;
          (pWal->hdr).aCksum[0] = 0;
          (pWal->hdr).aCksum[1] = 0;
          (pWal->hdr).mxFrame = 0;
          (pWal->hdr).nPage = 0;
          (pWal->hdr).aFrameCksum[0] = 0;
          (pWal->hdr).aFrameCksum[1] = 0;
          local_a8 = 0;
          uStack_a0 = 0;
          (pWal->hdr).iVersion = 0;
          (pWal->hdr).unused = 0;
          (pWal->hdr).iChange = 0;
          (pWal->hdr).isInit = '\0';
          (pWal->hdr).bigEndCksum = '\0';
          (pWal->hdr).szPage = 0;
          iVar3 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&nSize);
          if (iVar3 == 0) {
            if (0x20 < nSize) {
              iVar3 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_58,0x20,0);
              if (iVar3 != 0) goto LAB_00126672;
              if ((local_58._3_1_ & 0xfffffffe |
                  (local_58 >> 0x10 & 0xff) << 8 | (local_58 >> 8 & 0xff) << 0x10 | local_58 << 0x18
                  ) == 0x377f0682) {
                uVar9 = (local_50 >> 8 & 0xff) << 0x10 | local_50 << 0x18;
                uVar5 = (local_50 >> 0x10 & 0xff) << 8;
                uVar11 = local_50 >> 0x18 | uVar9 | uVar5;
                if (0xffff01fe < uVar11 - 0x10001 && (uVar11 & uVar11 - 1) == 0) {
                  (pWal->hdr).bigEndCksum = (u8)(local_58._3_1_ & 1);
                  pWal->szPage = uVar11;
                  pWal->nCkpt = local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 |
                                (local_4c & 0xff00) << 8 | local_4c << 0x18;
                  *(undefined8 *)(pWal->hdr).aSalt = local_48;
                  local_60 = (pWal->hdr).aFrameCksum;
                  walChecksumBytes(local_58._3_1_ & 1 ^ 1,(u8 *)&local_58,0x18,(u32 *)0x0,local_60);
                  if (((pWal->hdr).aFrameCksum[0] ==
                       (local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 |
                       local_40 << 0x18)) &&
                     ((pWal->hdr).aFrameCksum[1] ==
                      (local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                      local_3c << 0x18))) {
                    if ((local_54 >> 0x18 | (local_54 & 0xff0000) >> 8 | (local_54 & 0xff00) << 8 |
                        local_54 << 0x18) == 0x2de218) {
                      uVar11 = uVar11 + 0x18;
                      p = (u8 *)sqlite3_malloc64((ulong)uVar11);
                      iVar3 = 7;
                      if (p != (u8 *)0x0) {
                        local_68 = (pWal->hdr).aSalt;
                        local_78 = p + 0x18;
                        local_70 = (long *)(p + 8);
                        local_90 = p + 4;
                        local_80 = p + 0x10;
                        local_88 = p + 0x14;
                        local_a8 = 0;
                        local_d0 = 0x20;
                        local_e0 = 0;
                        do {
                          uStack_a0 = 0;
                          lVar10 = local_d0;
                          do {
                            local_d0 = (ulong)uVar11 + lVar10;
                            iVar12 = 0;
                            iVar3 = iVar12;
                            if ((((nSize < local_d0) ||
                                 (iVar3 = (*pWal->pWalFd->pMethods->xRead)
                                                    (pWal->pWalFd,p,uVar11,lVar10), iVar3 != 0)) ||
                                (iVar3 = iVar12, *(long *)local_68 != *local_70)) ||
                               (uVar6 = sqlite3Get4byte(p), puVar1 = local_60, uVar6 == 0)) {
LAB_001265f2:
                              sqlite3_free(p);
                              if (iVar3 != 0) goto LAB_00126672;
                              goto LAB_00126601;
                            }
                            nativeCksum = (uint)((pWal->hdr).bigEndCksum == '\0');
                            walChecksumBytes(nativeCksum,p,8,local_60,local_60);
                            walChecksumBytes(nativeCksum,local_78,pWal->szPage,puVar1,puVar1);
                            uVar8 = (pWal->hdr).aFrameCksum[0];
                            uVar7 = sqlite3Get4byte(local_80);
                            iVar3 = 0;
                            if ((uVar8 != uVar7) ||
                               (uVar8 = (pWal->hdr).aFrameCksum[1],
                               uVar7 = sqlite3Get4byte(local_88), uVar8 != uVar7))
                            goto LAB_001265f2;
                            local_e0 = local_e0 + 1;
                            uVar8 = sqlite3Get4byte(local_90);
                            iVar3 = walIndexAppend(pWal,local_e0,uVar6);
                            if (iVar3 != 0) goto LAB_001265f2;
                            lVar10 = local_d0;
                          } while (uVar8 == 0);
                          (pWal->hdr).mxFrame = local_e0;
                          (pWal->hdr).nPage = uVar8;
                          (pWal->hdr).szPage = (ushort)(uVar9 >> 0x10) | (ushort)uVar5;
                          local_a8 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                        } while( true );
                      }
                    }
                    else {
                      iVar3 = sqlite3CantopenError(0xdb6b);
                    }
                    goto LAB_00126672;
                  }
                }
              }
            }
LAB_00126601:
            *(undefined8 *)(pWal->hdr).aFrameCksum = local_a8;
            walIndexWriteHdr(pWal);
            puVar1 = *pWal->apWiData;
            puVar1[0x18] = 0;
            puVar1[0x20] = (pWal->hdr).mxFrame;
            puVar1[0x19] = 0;
            for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
              puVar1[lVar10 + 0x1a] = 0xffffffff;
            }
            uVar6 = (pWal->hdr).mxFrame;
            if (uVar6 != 0) {
              puVar1[0x1a] = uVar6;
            }
            if ((pWal->hdr).nPage == 0) {
              iVar3 = 0;
            }
            else {
              iVar3 = 0;
              sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                          pWal->zWalName);
            }
          }
LAB_00126672:
          walUnlockExclusive(pWal,iVar4,n);
        }
        *pChanged = 1;
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
      iVar3 = iVar4;
    }
    pWal->writeLock = '\0';
    walUnlockExclusive(pWal,0,1);
    if (!bVar2) goto LAB_001261c1;
  }
  else {
    iVar3 = 0;
  }
  if ((pWal->hdr).iVersion != 0x2de218) {
    iVar3 = sqlite3CantopenError(0xdf24);
  }
LAB_001261c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    return rc;
  };
  assert( page0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->readOnly & WAL_SHM_RDONLY ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }

  return rc;
}